

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

vm_obj_id_t CVmObjBigNum::createu(int in_root_set,ulong val,size_t digits)

{
  vm_obj_id_t vVar1;
  CVmObject *this;
  ulong in_RDX;
  char *in_RSI;
  vm_obj_id_t id;
  undefined4 in_stack_ffffffffffffffd8;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  vVar1 = vm_new_id(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  CVmObject::operator_new(CONCAT44(vVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  CVmObjBigNum((CVmObjBigNum *)CONCAT44(vVar1,in_stack_ffffffffffffffe0),
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  this = vm_objp(0);
  get_ext((CVmObjBigNum *)this);
  set_uint_val(in_RSI,in_RDX);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjBigNum::createu(VMG_ int in_root_set,
                                  ulong val, size_t digits)
{
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    new (vmg_ id) CVmObjBigNum(vmg_ digits);
    set_uint_val(((CVmObjBigNum *)vm_objp(vmg_ id))->get_ext(), val);
    return id;
}